

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O0

CordRep * absl::lts_20250127::cord_internal::anon_unknown_10::Substring
                    (CordRep *rep,size_t offset,size_t n)

{
  bool bVar1;
  CordRepSubstring *pCVar2;
  CordRep *pCVar3;
  bool local_3d;
  CordRepSubstring *substring;
  size_t n_local;
  size_t offset_local;
  CordRep *rep_local;
  
  if (rep->length < n) {
    __assert_fail("n <= rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x28,
                  "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (rep->length <= offset) {
    __assert_fail("offset < rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x29,
                  "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (rep->length - n < offset) {
    __assert_fail("offset <= rep->length - n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x2a,
                  "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                 );
  }
  bVar1 = IsDataEdge(rep);
  if (!bVar1) {
    __assert_fail("IsDataEdge(rep)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x2b,
                  "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (n == 0) {
    rep_local = (CordRep *)0x0;
  }
  else if (n == rep->length) {
    rep_local = CordRep::Ref(rep);
  }
  else {
    n_local = offset;
    offset_local = (size_t)rep;
    if (rep->tag == '\x01') {
      pCVar2 = CordRep::substring(rep);
      n_local = pCVar2->start + offset;
      pCVar2 = CordRep::substring(rep);
      offset_local = (size_t)pCVar2->child;
    }
    bVar1 = CordRep::IsExternal((CordRep *)offset_local);
    local_3d = true;
    if (!bVar1) {
      local_3d = CordRep::IsFlat((CordRep *)offset_local);
    }
    if (local_3d == false) {
      __assert_fail("rep->IsExternal() || rep->IsFlat()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                    ,0x35,
                    "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                   );
    }
    rep_local = (CordRep *)operator_new(0x20);
    ((CordRepSubstring *)rep_local)->start = 0;
    ((CordRepSubstring *)rep_local)->child = (CordRep *)0x0;
    (((CordRepSubstring *)rep_local)->super_CordRep).length = 0;
    (((CordRepSubstring *)rep_local)->super_CordRep).refcount = (atomic<int>)0x0;
    (((CordRepSubstring *)rep_local)->super_CordRep).tag = '\0';
    (((CordRepSubstring *)rep_local)->super_CordRep).storage[0] = '\0';
    (((CordRepSubstring *)rep_local)->super_CordRep).storage[1] = '\0';
    (((CordRepSubstring *)rep_local)->super_CordRep).storage[2] = '\0';
    CordRepSubstring::CordRepSubstring((CordRepSubstring *)rep_local);
    (((CordRepSubstring *)rep_local)->super_CordRep).length = n;
    (((CordRepSubstring *)rep_local)->super_CordRep).tag = '\x01';
    ((CordRepSubstring *)rep_local)->start = n_local;
    pCVar3 = CordRep::Ref((CordRep *)offset_local);
    ((CordRepSubstring *)rep_local)->child = pCVar3;
  }
  return rep_local;
}

Assistant:

inline CordRep* Substring(CordRep* rep, size_t offset, size_t n) {
  assert(n <= rep->length);
  assert(offset < rep->length);
  assert(offset <= rep->length - n);
  assert(IsDataEdge(rep));

  if (n == 0) return nullptr;
  if (n == rep->length) return CordRep::Ref(rep);

  if (rep->tag == SUBSTRING) {
    offset += rep->substring()->start;
    rep = rep->substring()->child;
  }

  assert(rep->IsExternal() || rep->IsFlat());
  CordRepSubstring* substring = new CordRepSubstring();
  substring->length = n;
  substring->tag = SUBSTRING;
  substring->start = offset;
  substring->child = CordRep::Ref(rep);
  return substring;
}